

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  Rep *pRVar1;
  void *pvVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  Iterator *pIVar5;
  Snapshot *extraout_RDX;
  Slice key;
  WritableFile *file;
  string fname;
  void *local_98;
  Snapshot *pSStack_90;
  leveldb *local_88;
  WritableFile *local_80;
  Env *local_78;
  TableCache *local_70;
  void *local_68;
  Slice local_60;
  string local_50;
  
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  local_78 = env;
  local_70 = table_cache;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&local_50,dbname,meta->number);
  iVar3 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar3 != '\0') {
    (*local_78->_vptr_Env[4])(&local_98,local_78,&local_50,&local_80);
    *(void **)this = local_98;
    if ((Rep *)local_98 != (Rep *)0x0) goto LAB_00122124;
    local_88 = this;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_80);
    iVar3 = (*iter->_vptr_Iterator[8])(iter);
    std::__cxx11::string::_M_replace
              ((ulong)&meta->smallest,0,(char *)(meta->smallest).rep_._M_string_length,
               CONCAT44(extraout_var,iVar3));
    while (iVar3 = (*iter->_vptr_Iterator[2])(iter), (char)iVar3 != '\0') {
      iVar3 = (*iter->_vptr_Iterator[8])(iter);
      local_98 = (void *)CONCAT44(extraout_var_00,iVar3);
      pSStack_90 = extraout_RDX;
      std::__cxx11::string::_M_replace
                ((ulong)&meta->largest,0,(char *)(meta->largest).rep_._M_string_length,
                 (ulong)local_98);
      iVar3 = (*iter->_vptr_Iterator[9])(iter);
      local_60.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      TableBuilder::Add(this_00,(Slice *)&local_98,&local_60);
      (*iter->_vptr_Iterator[6])(iter);
    }
    TableBuilder::Finish((TableBuilder *)&local_98);
    this = local_88;
    pvVar2 = local_98;
    pRVar1 = *(Rep **)local_88;
    *(void **)local_88 = local_98;
    local_98 = pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
    if ((Rep *)pvVar2 == (Rep *)0x0) {
      uVar4 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar4;
      if (uVar4 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
      (*local_80->_vptr_WritableFile[5])(&local_98);
      *(void **)this = local_98;
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    if (*(long *)this == 0) {
      (*local_80->_vptr_WritableFile[3])(&local_98);
      *(void **)this = local_98;
    }
    if (local_80 != (WritableFile *)0x0) {
      (*local_80->_vptr_WritableFile[1])();
    }
    local_80 = (WritableFile *)0x0;
    if (*(long *)this == 0) {
      local_98 = (Rep *)0x100;
      pSStack_90 = (Snapshot *)0x0;
      pIVar5 = TableCache::NewIterator
                         (local_70,(ReadOptions *)&local_98,meta->number,meta->file_size,
                          (Table **)0x0);
      (*pIVar5->_vptr_Iterator[10])(&local_98,pIVar5);
      *(void **)this = local_98;
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
    }
  }
  (*iter->_vptr_Iterator[10])(&local_98,iter);
  if ((Rep *)local_98 != (Rep *)0x0) {
    operator_delete__(local_98);
    (*iter->_vptr_Iterator[10])(&local_98,iter);
    pRVar1 = *(Rep **)this;
    *(void **)this = local_98;
    local_98 = pRVar1;
    if (pRVar1 != (Rep *)0x0) {
      operator_delete__(pRVar1);
    }
  }
  if (((*(long *)this != 0) || (meta->file_size == 0)) &&
     ((*local_78->_vptr_Env[8])(&local_68,local_78,&local_50), local_68 != (void *)0x0)) {
    operator_delete__(local_68);
  }
LAB_00122124:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}